

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

ptr<buffer> __thiscall nuraft::inmem_log_store::pack(inmem_log_store *this,ulong index,int32 cnt)

{
  bool bVar1;
  element_type *peVar2;
  iterator this_00;
  buffer *buf_00;
  int in_ECX;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  log_entry *in_RSI;
  buffer *in_RDI;
  ptr<buffer> pVar3;
  ptr<buffer> *bb;
  shared_ptr<nuraft::buffer> *entry;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *__range1;
  ptr<buffer> buf;
  lock_guard<std::mutex> l;
  ptr<log_entry> le;
  ulong ii;
  size_t size_total;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_> logs;
  ptr<buffer> *buf_out;
  element_type *in_stack_ffffffffffffff08;
  element_type *in_stack_ffffffffffffff10;
  value_type *in_stack_ffffffffffffff18;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *in_stack_ffffffffffffff20;
  undefined1 *in_stack_ffffffffffffff28;
  buffer *in_stack_ffffffffffffff30;
  buffer *this_01;
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
  local_98;
  undefined1 *local_90;
  undefined1 local_81;
  undefined1 local_58 [16];
  ulong local_48;
  long local_40;
  undefined1 local_38 [28];
  int local_1c;
  ulong local_18;
  
  this_01 = in_RDI;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          *)0x1983ed);
  local_40 = 0;
  for (local_48 = local_18; local_48 < local_18 + (long)local_1c; local_48 = local_48 + 1) {
    std::shared_ptr<nuraft::log_entry>::shared_ptr
              ((shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08)
    ;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff10,
               (mutex_type *)in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff30 =
         (buffer *)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
         ::operator[](in_stack_ffffffffffffff50,&in_RSI->term_);
    in_stack_ffffffffffffff28 = local_58;
    std::shared_ptr<nuraft::log_entry>::operator=
              ((shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff10,
               (shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff08);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x198497);
    std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1984a1);
    log_entry::serialize(in_RSI);
    peVar2 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1984ba);
    in_stack_ffffffffffffff20 =
         (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          *)nuraft::buffer::size(peVar2);
    local_40 = (long)&(in_stack_ffffffffffffff20->
                      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + local_40;
    std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ::push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1984ff);
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x19850c);
  }
  local_81 = 0;
  nuraft::buffer::alloc((size_t)__end1._M_current);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1985be);
  nuraft::buffer::pos(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1985d6);
  nuraft::buffer::put(this_01,(int32)((ulong)in_RDI >> 0x20));
  local_90 = local_38;
  local_98._M_current =
       (shared_ptr<nuraft::buffer> *)
       std::
       vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
       begin((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              *)in_stack_ffffffffffffff08);
  this_00 = std::
            vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
            ::end((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                   *)in_stack_ffffffffffffff08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
                             *)in_stack_ffffffffffffff10,
                            (__normal_iterator<std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
                             *)in_stack_ffffffffffffff08), bVar1) {
    buf_00 = (buffer *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
             ::operator*(&local_98);
    in_stack_ffffffffffffff10 =
         std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )0x19864d);
    peVar2 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19865c);
    nuraft::buffer::size(peVar2);
    nuraft::buffer::put(this_01,(int32)((ulong)in_RDI >> 0x20));
    in_stack_ffffffffffffff08 =
         std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )0x198688);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff10);
    nuraft::buffer::put((buffer *)this_00._M_current,buf_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
    ::operator++(&local_98);
  }
  local_81 = 1;
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  ~vector(in_stack_ffffffffffffff20);
  pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  return (ptr<buffer>)pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> inmem_log_store::pack(ulong index, int32 cnt) {
    std::vector< ptr<buffer> > logs;

    size_t size_total = 0;
    for (ulong ii=index; ii<index+cnt; ++ii) {
        ptr<log_entry> le = nullptr;
        {   std::lock_guard<std::mutex> l(logs_lock_);
            le = logs_[ii];
        }
        assert(le.get());
        ptr<buffer> buf = le->serialize();
        size_total += buf->size();
        logs.push_back( buf );
    }

    ptr<buffer> buf_out = buffer::alloc
                          ( sizeof(int32) +
                            cnt * sizeof(int32) +
                            size_total );
    buf_out->pos(0);
    buf_out->put((int32)cnt);

    for (auto& entry: logs) {
        ptr<buffer>& bb = entry;
        buf_out->put((int32)bb->size());
        buf_out->put(*bb);
    }
    return buf_out;
}